

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# econftool.c
# Opt level: O0

char * replace_str(char *str,char *orig,char *rep)

{
  char *pcVar1;
  size_t sVar2;
  char *p;
  char *rep_local;
  char *orig_local;
  char *str_local;
  
  pcVar1 = strstr(str,orig);
  str_local = str;
  if (pcVar1 != (char *)0x0) {
    strncpy(replace_str::buffer,str,(long)pcVar1 - (long)str);
    replace_str::buffer[(long)pcVar1 - (long)str] = '\0';
    sVar2 = strlen(orig);
    sprintf(replace_str::buffer + ((long)pcVar1 - (long)str),"%s%s",rep,pcVar1 + sVar2);
    str_local = replace_str::buffer;
  }
  return str_local;
}

Assistant:

static char *replace_str(char *str, char *orig, char *rep)
{
  static char buffer[1024];
  char *p;

  if(!(p = strstr(str, orig)))
    return str;

  strncpy(buffer, str, p-str);
  buffer[p-str] = '\0';

  sprintf(buffer+(p-str), "%s%s", rep, p+strlen(orig));

  return buffer;
}